

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTryTableExpr
          (BinaryReaderIR *this,Type sig_type,CatchClauseVector *catches)

{
  Index IVar1;
  pointer pCVar2;
  Result RVar3;
  CatchClause *raw_catch;
  pointer pCVar4;
  Expr *local_180;
  _Head_base<0UL,_wabt::Expr_*,_false> local_160;
  Var local_158;
  Location local_108;
  TableCatch catch_;
  
  std::make_unique<wabt::TryTableExpr>();
  std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::reserve
            ((vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_> *)&local_180[4].loc,
             ((long)(catches->
                    super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(catches->
                   super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0xc);
  SetBlockDeclaration(this,(BlockDeclaration *)&local_180[1].loc.filename._M_str,sig_type);
  pCVar2 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar4 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>)
                ._M_impl.super__Vector_impl_data._M_start; pCVar4 != pCVar2; pCVar4 = pCVar4 + 1) {
    local_158.loc.field_1.field_0.line = 0;
    local_158.loc.field_1._4_8_ = 0;
    local_158.loc.filename._M_len = 0;
    local_158.loc.filename._M_str._0_4_ = 0;
    local_158.loc.filename._M_str._4_4_ = 0;
    TableCatch::TableCatch(&catch_,&local_158.loc);
    catch_.kind = pCVar4->kind;
    IVar1 = pCVar4->tag;
    GetLocation(&local_108,this);
    Var::Var(&local_158,IVar1,&local_108);
    Var::operator=(&catch_.tag,&local_158);
    Var::~Var(&local_158);
    IVar1 = pCVar4->depth;
    GetLocation(&local_108,this);
    Var::Var(&local_158,IVar1,&local_108);
    Var::operator=(&catch_.target,&local_158);
    Var::~Var(&local_158);
    std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::emplace_back<wabt::TableCatch>
              ((vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_> *)&local_180[4].loc,
               &catch_);
    TableCatch::~TableCatch(&catch_);
  }
  local_160._M_head_impl = local_180;
  RVar3 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_160);
  if (local_160._M_head_impl != (Expr *)0x0) {
    (*(local_160._M_head_impl)->_vptr_Expr[1])();
  }
  if (RVar3.enum_ == Error) {
    RVar3.enum_ = Error;
  }
  else {
    (this->module_->features_used).exceptions = true;
    RVar3 = PushLabel(this,TryTable,(ExprList *)&local_180[3].loc.filename._M_str,local_180);
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderIR::OnTryTableExpr(Type sig_type,
                                      const CatchClauseVector& catches) {
  auto expr_ptr = std::make_unique<TryTableExpr>();
  TryTableExpr* expr = expr_ptr.get();
  expr->catches.reserve(catches.size());
  SetBlockDeclaration(&expr->block.decl, sig_type);
  ExprList* expr_list = &expr->block.exprs;

  for (auto& raw_catch : catches) {
    TableCatch catch_;
    catch_.kind = raw_catch.kind;
    catch_.tag = Var(raw_catch.tag, GetLocation());
    catch_.target = Var(raw_catch.depth, GetLocation());
    expr->catches.push_back(std::move(catch_));
  }

  CHECK_RESULT(AppendExpr(std::move(expr_ptr)));
  module_->features_used.exceptions = true;
  return PushLabel(LabelType::TryTable, expr_list, expr);
}